

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

char * sanitize_cookie_path(char *cookie_path)

{
  char *pcVar1;
  size_t __n;
  
  pcVar1 = (*Curl_cstrdup)(cookie_path);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    __n = strlen(pcVar1);
    if (*pcVar1 == '\"') {
      memmove(pcVar1,pcVar1 + 1,__n);
      __n = __n - 1;
    }
    if (__n == 0) {
      if (*pcVar1 != '/') goto LAB_004bd0b8;
    }
    else {
      if (pcVar1[__n - 1] == '\"') {
        pcVar1[__n - 1] = '\0';
        __n = __n - 1;
      }
      if (*pcVar1 != '/') {
LAB_004bd0b8:
        (*Curl_cfree)(pcVar1);
        pcVar1 = (*Curl_cstrdup)("/");
        return pcVar1;
      }
      if ((__n != 0) && (pcVar1[__n - 1] == '/')) {
        pcVar1[__n - 1] = '\0';
      }
    }
  }
  return pcVar1;
}

Assistant:

static char *sanitize_cookie_path(const char *cookie_path)
{
  size_t len;
  char *new_path = strdup(cookie_path);
  if(!new_path)
    return NULL;

  /* some stupid site sends path attribute with '"'. */
  len = strlen(new_path);
  if(new_path[0] == '\"') {
    memmove((void *)new_path, (const void *)(new_path + 1), len);
    len--;
  }
  if(len && (new_path[len - 1] == '\"')) {
    new_path[len - 1] = 0x0;
    len--;
  }

  /* RFC6265 5.2.4 The Path Attribute */
  if(new_path[0] != '/') {
    /* Let cookie-path be the default-path. */
    free(new_path);
    new_path = strdup("/");
    return new_path;
  }

  /* convert /hoge/ to /hoge */
  if(len && new_path[len - 1] == '/') {
    new_path[len - 1] = 0x0;
  }

  return new_path;
}